

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void place_random_engraving(level *lev,char **engravings,int size)

{
  char *s;
  boolean bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool local_49;
  char *engraving;
  int tries;
  xchar sy;
  xchar sx;
  mkroom *some_room;
  int size_local;
  char **engravings_local;
  level *lev_local;
  
  engraving._0_4_ = 0;
  iVar2 = rn2(size);
  s = engravings[iVar2];
  do {
    iVar2 = (int)engraving;
    bVar1 = In_hell(&u.uz);
    if ((bVar1 == '\0') && (1 < lev->nroom)) {
      iVar3 = rn2(lev->nroom + -1);
      iVar4 = somex(lev->rooms + iVar3);
      engraving._7_1_ = (char)iVar4;
      iVar3 = somey(lev->rooms + iVar3);
      engraving._6_1_ = (char)iVar3;
    }
    else {
      iVar3 = rn2(0x50);
      engraving._7_1_ = (char)iVar3;
      iVar3 = rn2(0x15);
      engraving._6_1_ = (char)iVar3;
    }
    bVar1 = occupied(lev,engraving._7_1_,engraving._6_1_);
    if (bVar1 != '\0') {
      engraving._0_4_ = (int)engraving + 1;
    }
    local_49 = bVar1 != '\0' && iVar2 < 100;
  } while (local_49);
  if ((int)engraving < 100) {
    make_engr_at(lev,(int)engraving._7_1_,(int)engraving._6_1_,s,0,'\x03');
  }
  return;
}

Assistant:

static void place_random_engraving(struct level *lev, const char *const engravings[],
				   const int size)
{
	struct mkroom *some_room;
	xchar sx, sy;
	int tries = 0;
	char const *engraving = engravings[rn2(size)];

	do {
	    if (Inhell || lev->nroom <= 1) {
		/* random placement in Gehennom or levels with no rooms */
		sx = rn2(COLNO);
		sy = rn2(ROWNO);
	    } else {
		/* placement inside of rooms, not corridors */
		some_room = &lev->rooms[rn2(lev->nroom - 1)];
		sx = somex(some_room);
		sy = somey(some_room);
	    }
	} while (occupied(lev, sx, sy) && tries++ < 100);

	if (tries < 100)
	    make_engr_at(lev, sx, sy, engraving, 0L, BURN);
}